

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

map * __thiscall implementations::scheme::environment::find(environment *this,string *var)

{
  iterator iVar1;
  ostream *poVar2;
  
  do {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>_>
            ::find(&(this->env_)._M_t,var);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->env_)._M_t._M_impl.super__Rb_tree_header) {
      return &this->env_;
    }
    this = (this->outer_).
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  } while (this != (element_type *)0x0);
  poVar2 = std::operator<<((ostream *)&std::cout,"unbound symbol \'");
  poVar2 = std::operator<<(poVar2,(string *)var);
  std::operator<<(poVar2,"\'\n");
  exit(1);
}

Assistant:

map & find(const std::string & var)
	{
		if (env_.find(var) != env_.end())
			return env_; // the symbol exists in this environment
		if (outer_)
			return outer_->find(var); // attempt to find the symbol in some "outer" env
		std::cout << "unbound symbol '" << var << "'\n";
		exit(1);
	}